

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

void __thiscall neueda::cdr::deleteItem(cdr *this,cdrKey_t *key)

{
  size_type sVar1;
  map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
  *in_RSI;
  key_type_conflict *in_RDI;
  key_type *in_stack_ffffffffffffffd8;
  map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
  *this_00;
  
  sVar1 = std::
          map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
          ::count(in_RSI,in_RDI);
  if (sVar1 != 0) {
    this_00 = (map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
               *)(in_RDI + 4);
    std::
    map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::operator[]((map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
                  *)this,key);
    std::
    map<unsigned_int,_neueda::cdrItem_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_neueda::cdrItem_*>_>_>
    ::erase(this_00,in_stack_ffffffffffffffd8);
    std::
    map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
    ::erase((map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
             *)this_00,(key_type_conflict *)in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
cdr::deleteItem (const cdrKey_t& key)
{
    if (mItems.count (key) != 0)
    {
        mOrdered.erase (mItems[key].mIndex);
        mItems.erase (key);
    }
}